

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O0

uchar * base64_decode(char *data,size_t input_length,size_t *output_length)

{
  uint32_t uVar1;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  uint32_t triple;
  uint32_t sextet_d;
  uint32_t sextet_c;
  uint32_t sextet_b;
  uint32_t sextet_a;
  int j;
  int i;
  uchar *decoded_data;
  size_t *output_length_local;
  size_t input_length_local;
  char *data_local;
  
  if (decoding_table == (char *)0x0) {
    build_decoding_table();
  }
  if ((input_length & 3) == 0) {
    *output_length = (input_length >> 2) * 3;
    if (data[input_length - 1] == '=') {
      *output_length = *output_length - 1;
    }
    if (data[input_length - 2] == '=') {
      *output_length = *output_length - 1;
    }
    data_local = (char *)malloc(*output_length);
    if (data_local == (char *)0x0) {
      data_local = (char *)0x0;
    }
    else {
      sextet_a = 0;
      sextet_b = 0;
      while (uVar1 = sextet_a, (ulong)(long)(int)sextet_a < input_length) {
        if (data[(int)sextet_a] == '=') {
          local_50 = 0;
        }
        else {
          local_50 = (int)decoding_table[data[(int)sextet_a]];
        }
        sextet_a = sextet_a + 1;
        if (data[(int)sextet_a] == '=') {
          local_54 = 0;
        }
        else {
          local_54 = (int)decoding_table[data[(int)sextet_a]];
        }
        sextet_a = uVar1 + 2;
        if (data[(int)sextet_a] == '=') {
          local_58 = 0;
        }
        else {
          local_58 = (int)decoding_table[data[(int)sextet_a]];
        }
        sextet_a = uVar1 + 3;
        if (data[(int)sextet_a] == '=') {
          local_5c = 0;
        }
        else {
          local_5c = (int)decoding_table[data[(int)sextet_a]];
        }
        sextet_a = uVar1 + 4;
        local_5c = local_50 * 0x40000 + local_54 * 0x1000 + local_58 * 0x40 + local_5c;
        if ((ulong)(long)(int)sextet_b < *output_length) {
          data_local[(int)sextet_b] = (char)((uint)local_5c >> 0x10);
          sextet_b = sextet_b + 1;
        }
        if ((ulong)(long)(int)sextet_b < *output_length) {
          data_local[(int)sextet_b] = (char)((uint)local_5c >> 8);
          sextet_b = sextet_b + 1;
        }
        if ((ulong)(long)(int)sextet_b < *output_length) {
          data_local[(int)sextet_b] = (char)local_5c;
          sextet_b = sextet_b + 1;
        }
      }
    }
  }
  else {
    data_local = (char *)0x0;
  }
  return (uchar *)data_local;
}

Assistant:

unsigned char *base64_decode(const char *data,
                             size_t input_length,
                             size_t *output_length) {

    if (decoding_table == NULL) build_decoding_table();

    if (input_length % 4 != 0) return NULL;

    *output_length = input_length / 4 * 3;
    if (data[input_length - 1] == '=') (*output_length)--;
    if (data[input_length - 2] == '=') (*output_length)--;

    unsigned char *decoded_data = malloc(*output_length);
    if (decoded_data == NULL) return NULL;

    for (int i = 0, j = 0; i < input_length;) {

        uint32_t sextet_a = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_b = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_c = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];
        uint32_t sextet_d = data[i] == '=' ? 0 & i++ : decoding_table[data[i++]];

        uint32_t triple = (sextet_a << 3 * 6)
        + (sextet_b << 2 * 6)
        + (sextet_c << 1 * 6)
        + (sextet_d << 0 * 6);

        if (j < *output_length) decoded_data[j++] = (triple >> 2 * 8) & 0xFF;
        if (j < *output_length) decoded_data[j++] = (triple >> 1 * 8) & 0xFF;
        if (j < *output_length) decoded_data[j++] = (triple >> 0 * 8) & 0xFF;
    }

    return decoded_data;
}